

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

string * __thiscall
rcg::getEnum_abi_cxx11_
          (string *__return_storage_ptr__,rcg *this,shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,
          char *name,bool exception)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  char *__s;
  invalid_argument *piVar5;
  long *plVar6;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  
  cVar2 = (char)name;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  plVar4 = *(long **)this;
  GenICam_3_4::gcstring::gcstring((gcstring *)&local_80,(char *)nodemap);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4,&local_80);
  GenICam_3_4::gcstring::~gcstring((gcstring *)&local_80);
  if (plVar4 == (long *)0x0) {
    if (cVar2 != '\0') {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Feature not found: ","");
      plVar4 = (long *)std::__cxx11::string::append((char *)local_a0);
      local_80 = (long *)*plVar4;
      plVar6 = plVar4 + 2;
      if (local_80 == plVar6) {
        local_70 = *plVar6;
        lStack_68 = plVar4[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar6;
      }
      local_78 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar5,(string *)&local_80);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar3 = (*(code *)**(undefined8 **)((long)plVar4 + *(long *)(*plVar4 + -0x28)))
                      ((long)plVar4 + *(long *)(*plVar4 + -0x28));
    if (iVar3 - 3U < 2) {
      plVar4 = (long *)__dynamic_cast(plVar4,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
      if (plVar4 == (long *)0x0) {
        if (cVar2 != '\0') {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          local_a0[0] = local_90;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a0,"Feature not enumeration: ","");
          plVar4 = (long *)std::__cxx11::string::append((char *)local_a0);
          local_80 = (long *)*plVar4;
          plVar6 = plVar4 + 2;
          if (local_80 == plVar6) {
            local_70 = *plVar6;
            lStack_68 = plVar4[3];
            local_80 = &local_70;
          }
          else {
            local_70 = *plVar6;
          }
          local_78 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::invalid_argument::invalid_argument(piVar5,(string *)&local_80);
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        plVar4 = (long *)(**(code **)(*plVar4 + 0x78))(plVar4,0,0);
        if (plVar4 == (long *)0x0) {
          if (cVar2 != '\0') {
            piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
            local_a0[0] = local_90;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a0,"Current value is not defined: ","");
            plVar4 = (long *)std::__cxx11::string::append((char *)local_a0);
            local_80 = (long *)*plVar4;
            plVar6 = plVar4 + 2;
            if (local_80 == plVar6) {
              local_70 = *plVar6;
              lStack_68 = plVar4[3];
              local_80 = &local_70;
            }
            else {
              local_70 = *plVar6;
            }
            local_78 = plVar4[1];
            *plVar4 = (long)plVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::invalid_argument::invalid_argument(piVar5,(string *)&local_80);
            __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
        }
        else {
          (**(code **)(*plVar4 + 0x40))(&local_80);
          __s = GenICam_3_4::gcstring::operator_cast_to_char_((gcstring *)&local_80);
          pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)__s);
          GenICam_3_4::gcstring::~gcstring((gcstring *)&local_80);
        }
      }
    }
    else if (cVar2 != '\0') {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Feature not readable: ","");
      plVar4 = (long *)std::__cxx11::string::append((char *)local_a0);
      local_80 = (long *)*plVar4;
      plVar6 = plVar4 + 2;
      if (local_80 == plVar6) {
        local_70 = *plVar6;
        lStack_68 = plVar4[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar6;
      }
      local_78 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar5,(string *)&local_80);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getEnum(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                    bool exception)
{
  std::string ret;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        GenApi::IEnumeration *val=dynamic_cast<GenApi::IEnumeration *>(node);

        if (val != 0)
        {
          GenApi::IEnumEntry *entry=val->GetCurrentEntry();

          if (entry != 0)
          {
            ret=entry->GetSymbolic();
          }
          else if (exception)
          {
            throw std::invalid_argument(std::string("Current value is not defined: ")+name);
          }
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not enumeration: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}